

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_loop.c
# Opt level: O0

int dec_loop_ssse3_inner(uint8_t **s,uint8_t **o,size_t *rounds)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  ulong uVar9;
  undefined8 extraout_XMM0_Qa;
  ulong uVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb;
  ulong uVar13;
  ulong uVar14;
  __m128i in;
  __m128i roll;
  __m128i eq_2F;
  __m128i lo;
  __m128i hi;
  __m128i lo_nibbles;
  __m128i hi_nibbles;
  __m128i str;
  __m128i mask_2F;
  __m128i lut_roll;
  __m128i lut_hi;
  __m128i lut_lo;
  size_t *rounds_local;
  uint8_t **o_local;
  uint8_t **s_local;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  in[0]._1_7_ = (undefined7)((ulong)s >> 8);
  in[1]._1_7_ = (undefined7)((ulong)o >> 8);
  in[0]._0_1_ = 0xbf;
  in[1]._0_1_ = 4;
  uVar2 = *(ulong *)*s;
  uVar3 = *(ulong *)((long)*s + 8);
  local_88 = (uint)uVar2;
  uStack_80 = (uint)uVar3;
  uVar9 = CONCAT44((uint)(uVar2 >> 0x24),local_88 >> 4) & 0x2f2f2f2f2f2f2f2f;
  uVar12 = CONCAT44((uint)(uVar3 >> 0x24),uStack_80 >> 4) & 0x2f2f2f2f2f2f2f2f;
  auVar6._8_8_ = 0x1010101010101010;
  auVar6._0_8_ = 0x804080402011010;
  auVar10._8_8_ = uVar12;
  auVar10._0_8_ = uVar9;
  auVar10 = pshufb(auVar6,auVar10);
  auVar5._8_8_ = 0x1a1b1b1b1a131111;
  auVar5._0_8_ = 0x1111111111111115;
  auVar11._8_8_ = uVar3 & 0x2f2f2f2f2f2f2f2f;
  auVar11._0_8_ = uVar2 & 0x2f2f2f2f2f2f2f2f;
  auVar11 = pshufb(auVar5,auVar11);
  eq_2F[1] = auVar11._0_8_;
  lo[0] = auVar11._8_8_;
  lo[1] = auVar10._0_8_;
  hi[0] = auVar10._8_8_;
  uVar13 = eq_2F[1] & lo[1];
  uVar14 = lo[0] & hi[0];
  local_e8 = (char)uVar13;
  cStack_e7 = (char)(uVar13 >> 8);
  cStack_e6 = (char)(uVar13 >> 0x10);
  cStack_e5 = (char)(uVar13 >> 0x18);
  cStack_e4 = (char)(uVar13 >> 0x20);
  cStack_e3 = (char)(uVar13 >> 0x28);
  cStack_e2 = (char)(uVar13 >> 0x30);
  cStack_e1 = (char)(uVar13 >> 0x38);
  cStack_e0 = (char)uVar14;
  cStack_df = (char)(uVar14 >> 8);
  cStack_de = (char)(uVar14 >> 0x10);
  cStack_dd = (char)(uVar14 >> 0x18);
  cStack_dc = (char)(uVar14 >> 0x20);
  cStack_db = (char)(uVar14 >> 0x28);
  cStack_da = (char)(uVar14 >> 0x30);
  cStack_d9 = (char)(uVar14 >> 0x38);
  auVar7[1] = -('\0' < cStack_e7);
  auVar7[0] = -('\0' < local_e8);
  auVar7[2] = -('\0' < cStack_e6);
  auVar7[3] = -('\0' < cStack_e5);
  auVar7[4] = -('\0' < cStack_e4);
  auVar7[5] = -('\0' < cStack_e3);
  auVar7[6] = -('\0' < cStack_e2);
  auVar7[7] = -('\0' < cStack_e1);
  auVar7[8] = -('\0' < cStack_e0);
  auVar7[9] = -('\0' < cStack_df);
  auVar7[10] = -('\0' < cStack_de);
  auVar7[0xb] = -('\0' < cStack_dd);
  auVar7[0xc] = -('\0' < cStack_dc);
  auVar7[0xd] = -('\0' < cStack_db);
  auVar7[0xe] = -('\0' < cStack_da);
  auVar7[0xf] = -('\0' < cStack_d9);
  bVar8 = (((((((((((((((auVar7 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar7 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar7 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar7 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar7 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar7 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar7 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar7 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar7 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar7 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar7 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar7 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar7 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar7 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar7 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < -('\0' < cStack_d9);
  if (bVar8) {
    local_48 = (char)uVar2;
    cStack_47 = (char)(uVar2 >> 8);
    cStack_46 = (char)(uVar2 >> 0x10);
    cStack_45 = (char)(uVar2 >> 0x18);
    cStack_44 = (char)(uVar2 >> 0x20);
    cStack_43 = (char)(uVar2 >> 0x28);
    cStack_42 = (char)(uVar2 >> 0x30);
    cStack_41 = (char)(uVar2 >> 0x38);
    cStack_40 = (char)uVar3;
    cStack_3f = (char)(uVar3 >> 8);
    cStack_3e = (char)(uVar3 >> 0x10);
    cStack_3d = (char)(uVar3 >> 0x18);
    cStack_3c = (char)(uVar3 >> 0x20);
    cStack_3b = (char)(uVar3 >> 0x28);
    cStack_3a = (char)(uVar3 >> 0x30);
    cStack_39 = (char)(uVar3 >> 0x38);
    local_b8 = (char)uVar9;
    cStack_b7 = (char)(uVar9 >> 8);
    cStack_b6 = (char)(uVar9 >> 0x10);
    cStack_b5 = (char)(uVar9 >> 0x18);
    cStack_b4 = (char)(uVar9 >> 0x20);
    cStack_b3 = (char)(uVar9 >> 0x28);
    cStack_b2 = (char)(uVar9 >> 0x30);
    cStack_b1 = (char)(uVar9 >> 0x38);
    cStack_b0 = (char)uVar12;
    cStack_af = (char)(uVar12 >> 8);
    cStack_ae = (char)(uVar12 >> 0x10);
    cStack_ad = (char)(uVar12 >> 0x18);
    cStack_ac = (char)(uVar12 >> 0x20);
    cStack_ab = (char)(uVar12 >> 0x28);
    cStack_aa = (char)(uVar12 >> 0x30);
    cStack_a9 = (char)(uVar12 >> 0x38);
    auVar4[1] = cStack_b7 - (cStack_47 == '/');
    auVar4[0] = local_b8 - (local_48 == '/');
    auVar4[2] = cStack_b6 - (cStack_46 == '/');
    auVar4[3] = cStack_b5 - (cStack_45 == '/');
    auVar4[4] = cStack_b4 - (cStack_44 == '/');
    auVar4[5] = cStack_b3 - (cStack_43 == '/');
    auVar4[6] = cStack_b2 - (cStack_42 == '/');
    auVar4[7] = cStack_b1 - (cStack_41 == '/');
    auVar4[8] = cStack_b0 - (cStack_40 == '/');
    auVar4[9] = cStack_af - (cStack_3f == '/');
    auVar4[10] = cStack_ae - (cStack_3e == '/');
    auVar4[0xb] = cStack_ad - (cStack_3d == '/');
    auVar4[0xc] = cStack_ac - (cStack_3c == '/');
    auVar4[0xd] = cStack_ab - (cStack_3b == '/');
    auVar4[0xe] = cStack_aa - (cStack_3a == '/');
    auVar4[0xf] = cStack_a9 - (cStack_39 == '/');
    pshufb(ZEXT816(0xb9b9bfbf04131000),auVar4);
    dec_reshuffle(in);
    puVar1 = *o;
    *(undefined8 *)puVar1 = extraout_XMM0_Qa;
    *(undefined8 *)(puVar1 + 8) = extraout_XMM0_Qb;
    *s = *s + 0x10;
    *o = *o + 0xc;
    *rounds = *rounds - 1;
  }
  s_local._4_4_ = (uint)bVar8;
  return s_local._4_4_;
}

Assistant:

static inline int
dec_loop_ssse3_inner (const uint8_t **s, uint8_t **o, size_t *rounds)
{
	const __m128i lut_lo = _mm_setr_epi8(
		0x15, 0x11, 0x11, 0x11, 0x11, 0x11, 0x11, 0x11,
		0x11, 0x11, 0x13, 0x1A, 0x1B, 0x1B, 0x1B, 0x1A);

	const __m128i lut_hi = _mm_setr_epi8(
		0x10, 0x10, 0x01, 0x02, 0x04, 0x08, 0x04, 0x08,
		0x10, 0x10, 0x10, 0x10, 0x10, 0x10, 0x10, 0x10);

	const __m128i lut_roll = _mm_setr_epi8(
		0,  16,  19,   4, -65, -65, -71, -71,
		0,   0,   0,   0,   0,   0,   0,   0);

	const __m128i mask_2F = _mm_set1_epi8(0x2F);

	// Load input:
	__m128i str = _mm_loadu_si128((__m128i *) *s);

	// Table lookups:
	const __m128i hi_nibbles = _mm_and_si128(_mm_srli_epi32(str, 4), mask_2F);
	const __m128i lo_nibbles = _mm_and_si128(str, mask_2F);
	const __m128i hi         = _mm_shuffle_epi8(lut_hi, hi_nibbles);
	const __m128i lo         = _mm_shuffle_epi8(lut_lo, lo_nibbles);

	// Check for invalid input: if any "and" values from lo and hi are not
	// zero, fall back on bytewise code to do error checking and reporting:
	if (_mm_movemask_epi8(_mm_cmpgt_epi8(_mm_and_si128(lo, hi), _mm_setzero_si128())) != 0) {
		return 0;
	}

	const __m128i eq_2F = _mm_cmpeq_epi8(str, mask_2F);
	const __m128i roll  = _mm_shuffle_epi8(lut_roll, _mm_add_epi8(eq_2F, hi_nibbles));

	// Now simply add the delta values to the input:
	str = _mm_add_epi8(str, roll);

	// Reshuffle the input to packed 12-byte output format:
	str = dec_reshuffle(str);

	// Store the output:
	_mm_storeu_si128((__m128i *) *o, str);

	*s += 16;
	*o += 12;
	*rounds -= 1;

	return 1;
}